

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O1

void labpack_writer_begin_map(labpack_writer_t *writer,uint32_t count)

{
  mpack_error_t error;
  char *pcVar1;
  
  if (writer != (labpack_writer_t *)0x0) {
    if (writer->status == LABPACK_STATUS_OK) {
      mpack_start_map(writer->encoder,count);
      error = writer->encoder->error;
      if (error != mpack_ok) {
        writer->status = LABPACK_STATUS_ERROR_ENCODER;
        pcVar1 = labpack_mpack_error_message(error);
        writer->status_message = pcVar1;
      }
    }
    return;
  }
  __assert_fail("writer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                ,0x17a,"void labpack_writer_begin_map(labpack_writer_t *, uint32_t)");
}

Assistant:

void
labpack_writer_begin_map(labpack_writer_t* writer, uint32_t count)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        mpack_start_map(writer->encoder, count);
        labpack_writer_check_encoder(writer);
    }
}